

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

int INT_EVtransfer_events(CManager_conflict cm,EVstone src_stone_id,EVstone dest_stone_id)

{
  event_path_data evp;
  queue_item *pqVar1;
  queue_item *to_dequeue;
  stone_type stone;
  stone_type p_Var2;
  event_item *event;
  int iVar3;
  CManager_conflict evp_00;
  
  evp = cm->evp;
  stone = stone_struct(evp,src_stone_id);
  iVar3 = -1;
  if ((stone != (stone_type)0x0) &&
     (p_Var2 = stone_struct(evp,dest_stone_id), p_Var2 != (stone_type)0x0)) {
    iVar3 = 0;
    to_dequeue = stone->queue->queue_head;
    while (to_dequeue != (queue_item *)0x0) {
      pqVar1 = to_dequeue->next;
      event = dequeue_item(cm,stone,to_dequeue);
      evp_00 = cm;
      internal_path_submit(cm,dest_stone_id,event);
      return_event((event_path_data)evp_00,event);
      iVar3 = iVar3 + 1;
      to_dequeue = pqVar1;
    }
  }
  return iVar3;
}

Assistant:

extern int
INT_EVtransfer_events(CManager cm, EVstone src_stone_id, EVstone dest_stone_id)
{
    event_path_data evp = cm->evp;
    stone_type src_stone, dest_stone;
    int count = 0;
    queue_item * item;
    event_item * event;

    src_stone = stone_struct(evp, src_stone_id);
    if (!src_stone) return -1;
    dest_stone = stone_struct(evp, dest_stone_id);
    if (!dest_stone) return -1;
    item = src_stone->queue->queue_head;
    while (item != NULL) {
	queue_item *next = item->next;
	event = dequeue_item(cm, src_stone, item);
	internal_path_submit(cm, dest_stone_id, event);
	return_event(evp, event);
	count++;
	item = next;
    }
    return count;
}